

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O3

cf_bool_t string_stream_read(void *stream,cf_char_t *buff,cf_size_t size)

{
  cf_char_t *pcVar1;
  long lVar2;
  char cVar3;
  ulong uVar4;
  bool bVar5;
  
  lVar2 = *(long *)((long)stream + 8);
  cVar3 = *(char *)(*stream + lVar2);
  if (size != 0 && cVar3 != '\0') {
    pcVar1 = (cf_char_t *)(*stream + lVar2);
    uVar4 = 1;
    do {
      *(long *)((long)stream + 8) = lVar2 + 1;
      buff[uVar4 - 1] = *pcVar1;
      lVar2 = *(long *)((long)stream + 8);
      cVar3 = *(char *)(*stream + lVar2);
      if (cVar3 == '\0') break;
      pcVar1 = (cf_char_t *)(*stream + lVar2);
      bVar5 = uVar4 < size;
      uVar4 = uVar4 + 1;
    } while (bVar5);
  }
  return (cf_bool_t)(cVar3 != '\0');
}

Assistant:

cf_bool_t string_stream_read(void* stream, cf_char_t* buff, cf_size_t size) {
    string_stream_t* s = CF_TYPE_CAST(string_stream_t*, stream);
    size_t i = 0;
    while (s->str[s->read] != '\0' && i < size) {
        buff[i++] = s->str[s->read++];
    }
    if (s->str[s->read] == '\0') {
        return CF_FALSE;
    }

    return CF_TRUE;
}